

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff.cpp
# Opt level: O3

extent<char> __thiscall
anon_unknown.dwarf_1214cb::Diff::add
          (Diff *this,transaction_type *transaction,string *key,string *value)

{
  extent<char> eVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index;
  extent<char> value_extent;
  pair<std::shared_ptr<char>,_pstore::typed_address<char>_> local_150;
  extent<char> local_138;
  undefined1 local_128 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_*,_false>
  local_40;
  
  pstore::transaction_base::alloc_rw<char,void>
            (&local_150,&transaction->super_transaction_base,value->_M_string_length);
  this_00._M_pi =
       local_150.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (value->_M_string_length != 0) {
    memmove(local_150.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
            (value->_M_dataplus)._M_p,value->_M_string_length);
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)&local_150,&this->db_,true);
  local_138.size = value->_M_string_length;
  local_138.addr.a_.a_ = local_150.second.a_.a_;
  pstore::index::
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::insert_or_assign<std::__cxx11::string,pstore::extent<char>,void>
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_128,
             (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
              *)local_150.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &transaction->super_transaction_base,key,&local_138);
  if (local_40._M_head_impl !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                  *)&local_40,local_40._M_head_impl);
  }
  local_40._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
        *)0x0;
  if (local_150.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  eVar1.size = local_138.size;
  eVar1.addr.a_.a_ = local_138.addr.a_.a_;
  return eVar1;
}

Assistant:

pstore::extent<char> Diff::add (transaction_type & transaction, std::string const & key,
                                    std::string const & value) {
        auto where = pstore::typed_address<char>::null ();
        {
            // Allocate storage for string 'value' and copy the data into it.
            std::shared_ptr<char> ptr;
            std::tie (ptr, where) = transaction.alloc_rw<char> (value.length ());
            std::copy (std::begin (value), std::end (value), ptr.get ());
        }

        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        auto const value_extent = make_extent (where, value.length ());
        index->insert_or_assign (transaction, key, value_extent);
        return value_extent;
    }